

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O0

void __thiscall
bson_stream_encoder_reset_test_fixture::bson_stream_encoder_reset_test_fixture
          (bson_stream_encoder_reset_test_fixture *this)

{
  binary_stream_sink *in_RDI;
  binary_stream_sink *this_00;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  binary_stream_sink *in_stack_ffffffffffffffb0;
  binary_stream_sink *in_stack_ffffffffffffffb8;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffffc0
  ;
  
  this_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)in_RDI);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI[6].end_buffer_);
  jsoncons::binary_stream_sink::binary_stream_sink
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::allocator<char>::allocator();
  jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
  basic_bson_encoder(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (allocator<char> *)in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  jsoncons::binary_stream_sink::~binary_stream_sink(this_00);
  return;
}

Assistant:

bson_stream_encoder_reset_test_fixture() : encoder(output1) {}